

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Permutahedral_representation_iterators.h
# Opt level: O2

void __thiscall
Gudhi::coxeter_triangulation::
Face_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
::Face_iterator(Face_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                *this,Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                      *simplex,uint *k)

{
  uint uVar1;
  allocator_type local_52;
  allocator_type local_51;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  local_50;
  _Vector_base<int,_std::allocator<int>_> local_38;
  
  Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ::Permutahedral_representation(&this->simplex_,simplex);
  uVar1 = *k;
  this->k_ = uVar1;
  local_38._M_impl.super__Vector_impl_data._M_start._0_4_ =
       (int)(((long)(simplex->partition_).
                    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(simplex->partition_).
                   super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x18);
  this->l_ = (int)local_38._M_impl.super__Vector_impl_data._M_start - 1;
  local_50.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = uVar1 + 1;
  Combination_iterator::Combination_iterator(&this->c_it_,(uint *)&local_38,(uint *)&local_50);
  (this->c_end_).value_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->c_end_).value_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->c_end_).value_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->c_end_).is_end_ = true;
  (this->c_end_).n_ = 0;
  (this->c_end_).k_ = 0;
  this->is_end_ = this->l_ < this->k_;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_38,
             (long)(simplex->vertex_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(simplex->vertex_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2,&local_51);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector(&local_50,(ulong)(*k + 1),&local_52);
  Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ::Permutahedral_representation(&this->value_,(Vertex *)&local_38,&local_50);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector(&local_50);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_38);
  update_value(this);
  return;
}

Assistant:

Face_iterator(const Permutahedral_representation& simplex, const uint& k)
      : simplex_(simplex),
        k_(k),
        l_(simplex.dimension()),
        c_it_(l_ + 1, k_ + 1),
        is_end_(k_ > l_),
        value_({Vertex(simplex.vertex().size()), Ordered_partition(k + 1)}) {
    update_value();
  }